

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall
Model::AddtRNA(Model *this,
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              *codon_map,
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
              *counts,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                      *rate_constants)

{
  double rate_constant_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  SpeciesTracker *this_00;
  pointer ppVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  iterator local_130;
  size_type local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  iterator local_d8;
  size_type local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  local_b0;
  double local_a8;
  double rate_constant;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  reference local_50;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>
  *trna;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
  *__range1;
  SpeciesTracker *tracker;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *rate_constants_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
  *counts_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *codon_map_local;
  Model *this_local;
  
  this_00 = SpeciesTracker::Instance();
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
           ::begin(counts);
  trna = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
            ::end(counts);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&trna);
    if (!bVar1) break;
    local_50 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>
               ::operator*(&__end1);
    std::operator+(&local_70,&local_50->first,"_charged");
    SpeciesTracker::Increment(this_00,&local_70,(local_50->second).first);
    std::__cxx11::string::~string((string *)&local_70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &rate_constant,&local_50->first,"_uncharged");
    SpeciesTracker::Increment
              (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rate_constant,(local_50->second).second);
    std::__cxx11::string::~string((string *)&rate_constant);
    local_b0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         ::find(rate_constants,&local_50->first);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
             ::operator->(&local_b0);
    rate_constant_00 = ppVar2->second;
    local_100 = &local_f8;
    local_a8 = rate_constant_00;
    std::operator+(local_100,&local_50->first,"_uncharged");
    local_d8 = &local_f8;
    local_d0 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_101);
    __l_00._M_len = local_d0;
    __l_00._M_array = local_d8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_c8,__l_00,&local_101);
    local_158 = &local_150;
    std::operator+(local_158,&local_50->first,"_charged");
    local_130 = &local_150;
    local_128 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_159);
    __l._M_len = local_128;
    __l._M_array = local_130;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_120,__l,&local_159);
    AddtRNAReaction(this,rate_constant_00,&local_c8,&local_120);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_120);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_159);
    local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130;
    do {
      local_1a8 = local_1a8 + -1;
      std::__cxx11::string::~string((string *)local_1a8);
    } while (local_1a8 != &local_150);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_101);
    local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8;
    do {
      local_1c0 = local_1c0 + -1;
      std::__cxx11::string::~string((string *)local_1c0);
    } while (local_1c0 != &local_f8);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>
    ::operator++(&__end1);
  }
  SpeciesTracker::codon_map(this_00,codon_map);
  return;
}

Assistant:

void Model::AddtRNA(std::map<std::string, std::vector<std::string>> &codon_map, 
                    std::map<std::string, std::pair<int, int>> &counts, 
                    std::map<std::string, double> &rate_constants) {
  auto &tracker = SpeciesTracker::Instance();
  for (auto const& trna : counts) {
    // Add initial charged tRNA species
    tracker.Increment(trna.first + "_charged", trna.second.first);
    // Add initial uncharged tRNA species
    tracker.Increment(trna.first + "_uncharged", trna.second.second);
    double rate_constant = rate_constants.find(trna.first)->second;
    AddtRNAReaction(rate_constant, {trna.first + "_uncharged"}, {trna.first + "_charged"});
  }
  tracker.codon_map(codon_map);
}